

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O0

void __thiscall irr::scene::SViewFrustum::SViewFrustum(SViewFrustum *this,SViewFrustum *other)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *in_RSI;
  vector3d<float> *in_RDI;
  u32 i;
  eConstructor in_stack_ffffffffffffffac;
  aabbox3d<float> *in_stack_ffffffffffffffb0;
  vector3d<float> *this_00;
  plane3d<float> *in_stack_ffffffffffffffc0;
  vector3d<float> *local_20;
  uint local_14;
  
  core::vector3d<float>::vector3d(in_RDI);
  local_20 = in_RDI + 1;
  do {
    core::plane3d<float>::plane3d(in_stack_ffffffffffffffc0);
    local_20 = (vector3d<float> *)&local_20[1].Y;
  } while (local_20 != in_RDI + 9);
  core::aabbox3d<float>::aabbox3d(in_stack_ffffffffffffffb0);
  this_00 = in_RDI + 0xb;
  do {
    core::CMatrix4<float>::CMatrix4((CMatrix4<float> *)this_00,in_stack_ffffffffffffffac);
    this_00 = (vector3d<float> *)&this_00[5].Y;
  } while (this_00 != (vector3d<float> *)&in_RDI[0x15].Z);
  core::vector3d<float>::vector3d((vector3d<float> *)&in_RDI[0x16].Y);
  uVar1 = *in_RSI;
  in_RDI->X = (float)(int)uVar1;
  in_RDI->Y = (float)(int)((ulong)uVar1 >> 0x20);
  in_RDI->Z = *(float *)(in_RSI + 1);
  uVar1 = *(undefined8 *)((long)in_RSI + 0x6c);
  in_RDI[9].X = (float)(int)uVar1;
  in_RDI[9].Y = (float)(int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&in_RDI[9].Z = *(undefined8 *)((long)in_RSI + 0x74);
  uVar1 = *(undefined8 *)((long)in_RSI + 0x7c);
  in_RDI[10].Y = (float)(int)uVar1;
  in_RDI[10].Z = (float)(int)((ulong)uVar1 >> 0x20);
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    puVar3 = (undefined8 *)((long)in_RSI + (ulong)local_14 * 0x10 + 0xc);
    puVar2 = (undefined8 *)((long)in_RDI + (ulong)local_14 * 0x10 + 0xc);
    *puVar2 = *puVar3;
    puVar2[1] = puVar3[1];
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    memcpy((void *)((long)in_RDI + (ulong)local_14 * 0x40 + 0x84),
           (void *)((long)in_RSI + (ulong)local_14 * 0x40 + 0x84),0x40);
  }
  in_RDI[0x15].Z = *(float *)((long)in_RSI + 0x104);
  in_RDI[0x16].X = *(float *)(in_RSI + 0x21);
  uVar1 = *(undefined8 *)((long)in_RSI + 0x10c);
  in_RDI[0x16].Y = (float)(int)uVar1;
  in_RDI[0x16].Z = (float)(int)((ulong)uVar1 >> 0x20);
  in_RDI[0x17].X = *(float *)((long)in_RSI + 0x114);
  return;
}

Assistant:

inline SViewFrustum::SViewFrustum(const SViewFrustum &other)
{
	cameraPosition = other.cameraPosition;
	boundingBox = other.boundingBox;

	u32 i;
	for (i = 0; i < VF_PLANE_COUNT; ++i)
		planes[i] = other.planes[i];

	for (i = 0; i < ETS_COUNT_FRUSTUM; ++i)
		Matrices[i] = other.Matrices[i];

	BoundingRadius = other.BoundingRadius;
	FarNearDistance = other.FarNearDistance;
	BoundingCenter = other.BoundingCenter;
}